

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

void linenoiseShow(linenoiseState *l)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  linenoiseCompletionCallback *plVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  linenoiseCompletions local_48;
  
  plVar4 = completionCallback;
  if (l->in_completion != 0) {
    local_48.path = 0;
    local_48._4_4_ = 0;
    local_48.len = 0;
    local_48.cvec = (char **)0x0;
    pcVar1 = l->buf;
    pcVar5 = strrchr(pcVar1,0x20);
    pcVar7 = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar7 = pcVar1;
    }
    (*plVar4)(pcVar1,pcVar7,&local_48);
    if (l->completion_idx < local_48.len) {
      pcVar1 = l->buf;
      sVar2 = l->pos;
      sVar3 = l->len;
      pcVar7 = local_48.cvec[l->completion_idx];
      sVar6 = strlen(pcVar7);
      l->pos = sVar6;
      l->len = sVar6;
      l->buf = pcVar7;
      refreshLineWithFlags(l,2);
      l->len = sVar3;
      l->pos = sVar2;
      l->buf = pcVar1;
    }
    else {
      refreshLineWithFlags(l,2);
    }
    return;
  }
  refreshLineWithFlags(l,2);
  return;
}

Assistant:

void linenoiseShow(struct linenoiseState *l) {
    if (l->in_completion) {
        refreshLineWithCompletion(l,NULL,REFRESH_WRITE);
    } else {
        refreshLineWithFlags(l,REFRESH_WRITE);
    }
}